

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.h
# Opt level: O1

void __thiscall Token::print(Token *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->syn);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->token)._M_dataplus._M_p,(this->token)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") {",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).row);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).col);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} - {",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).row);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).col);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return;
}

Assistant:

void print() const {
        std::cout << "(" << syn << "," << token << ") {"
                  << start_pos.row << ", " << start_pos.col << ", " << start_pos.index << "} - {"
                  << end_pos.row << ", " << end_pos.col << ", " << end_pos.index << "}";
    }